

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestConfigureHandler.cxx
# Opt level: O3

int __thiscall cmCTestConfigureHandler::ProcessHandler(cmCTestConfigureHandler *this)

{
  pointer pcVar1;
  _func_int **pp_Var2;
  cmCTest *pcVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  double dVar7;
  int retVal;
  cmXMLWriter xml;
  uint start_time_time;
  string cCommand;
  string output;
  string buildDirectory;
  ostringstream cmCTestLog_msg_5;
  string start_time;
  ostringstream cmCTestLog_msg;
  cmGeneratedFileStream ofs;
  int local_71c;
  undefined1 local_718 [48];
  int local_6e8;
  uint local_6e4;
  string local_6e0;
  string local_6c0;
  double local_6a0;
  string local_698;
  string local_678;
  undefined1 local_658 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_648 [6];
  ios_base local_5e8 [264];
  string local_4e0;
  undefined1 local_4c0 [32];
  byte abStack_4a0 [80];
  ios_base local_450 [472];
  undefined1 local_278 [16];
  _func_int *local_268 [2];
  byte abStack_258 [80];
  ios_base local_208 [472];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"Configure project",0x11);
  std::ios::widen((char)(ostringstream *)local_4c0 + (char)*(undefined8 *)(local_4c0._0_8_ + -0x18))
  ;
  std::ostream::put((char)local_4c0);
  std::ostream::flush();
  pcVar3 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar3,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
               ,0x27,(char *)local_278._0_8_,(this->super_cmCTestGenericHandler).Quiet);
  if ((_func_int **)local_278._0_8_ != local_268) {
    operator_delete((void *)local_278._0_8_,(ulong)(local_268[0] + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c0);
  std::ios_base::~ios_base(local_450);
  pcVar3 = (this->super_cmCTestGenericHandler).CTest;
  pcVar1 = local_4c0 + 0x10;
  local_4c0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4c0,"ConfigureCommand","");
  cmCTest::GetCTestConfiguration(&local_6c0,pcVar3,(string *)local_4c0);
  if ((pointer)local_4c0._0_8_ != pcVar1) {
    operator_delete((void *)local_4c0._0_8_,local_4c0._16_8_ + 1);
  }
  if (local_6c0._M_string_length == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_4c0,"Cannot find ConfigureCommand key in the DartConfiguration.tcl",
               0x3d);
    std::ios::widen((char)(ostream *)local_4c0 + (char)*(undefined8 *)(local_4c0._0_8_ + -0x18));
    std::ostream::put((char)local_4c0);
    std::ostream::flush();
    pcVar3 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                 ,0x2e,(char *)local_278._0_8_,false);
    if ((_func_int **)local_278._0_8_ != local_268) {
      operator_delete((void *)local_278._0_8_,(ulong)(local_268[0] + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c0);
    std::ios_base::~ios_base(local_450);
    iVar5 = -1;
    goto LAB_0027749e;
  }
  pcVar3 = (this->super_cmCTestGenericHandler).CTest;
  local_4c0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4c0,"BuildDirectory","");
  cmCTest::GetCTestConfiguration(&local_678,pcVar3,(string *)local_4c0);
  if ((pointer)local_4c0._0_8_ != pcVar1) {
    operator_delete((void *)local_4c0._0_8_,local_4c0._16_8_ + 1);
  }
  if (local_678._M_string_length == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_4c0,"Cannot find BuildDirectory  key in the DartConfiguration.tcl",
               0x3c);
    std::ios::widen((char)(ostream *)local_4c0 + (char)*(undefined8 *)(local_4c0._0_8_ + -0x18));
    std::ostream::put((char)local_4c0);
    std::ostream::flush();
    pcVar3 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                 ,0x38,(char *)local_278._0_8_,false);
    if ((_func_int **)local_278._0_8_ != local_268) {
      operator_delete((void *)local_278._0_8_,(ulong)(local_268[0] + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c0);
    std::ios_base::~ios_base(local_450);
    iVar5 = -1;
  }
  else {
    local_6a0 = cmsys::SystemTools::GetTime();
    local_698._M_string_length = 0;
    local_698.field_2._M_local_buf[0] = '\0';
    local_71c = 0;
    local_698._M_dataplus._M_p = (pointer)&local_698.field_2;
    bVar4 = cmCTest::GetShowOnly((this->super_cmCTestGenericHandler).CTest);
    if (bVar4) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4c0,"Configure with command: ",0x18);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_4c0,local_6c0._M_dataplus._M_p,local_6c0._M_string_length
                         );
      std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      pcVar3 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar3,0,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                   ,0x71,(char *)local_278._0_8_,(this->super_cmCTestGenericHandler).Quiet);
      if ((_func_int **)local_278._0_8_ != local_268) {
        operator_delete((void *)local_278._0_8_,(ulong)(local_268[0] + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c0);
      std::ios_base::~ios_base(local_450);
LAB_00276a10:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4c0,"Error(s) when configuring the project",0x25);
      std::ios::widen((char)(ostream *)local_4c0 + (char)*(undefined8 *)(local_4c0._0_8_ + -0x18));
      std::ostream::put((char)local_4c0);
      std::ostream::flush();
      pcVar3 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar3,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                   ,0x76,(char *)local_278._0_8_,false);
      if ((_func_int **)local_278._0_8_ != local_268) {
        operator_delete((void *)local_278._0_8_,(ulong)(local_268[0] + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c0);
      std::ios_base::~ios_base(local_450);
      iVar5 = -1;
    }
    else {
      cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_4c0);
      bVar4 = cmCTestGenericHandler::StartResultingXML
                        (&this->super_cmCTestGenericHandler,PartConfigure,"Configure",
                         (cmGeneratedFileStream *)local_4c0);
      if (bVar4) {
        cmCTest::CurrentTime_abi_cxx11_(&local_4e0,(this->super_cmCTestGenericHandler).CTest);
        dVar7 = cmsys::SystemTools::GetTime();
        local_6e4 = (uint)(long)dVar7;
        cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
        cmCTestGenericHandler::StartLogFile
                  (&this->super_cmCTestGenericHandler,"Configure",(cmGeneratedFileStream *)local_278
                  );
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_658);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_658,"Configure with command: ",0x18);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_658,local_6c0._M_dataplus._M_p,
                            local_6c0._M_string_length);
        std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        pcVar3 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar3,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                     ,0x50,(char *)local_718._0_8_,(this->super_cmCTestGenericHandler).Quiet);
        if ((ostream *)local_718._0_8_ != (ostream *)(local_718 + 0x10)) {
          operator_delete((void *)local_718._0_8_,
                          (ulong)((long)&((_Alloc_hider *)local_718._16_8_)->_M_p + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_658);
        std::ios_base::~ios_base(local_5e8);
        iVar5 = cmCTest::RunMakeCommand
                          ((this->super_cmCTestGenericHandler).CTest,local_6c0._M_dataplus._M_p,
                           &local_698,&local_71c,local_678._M_dataplus._M_p,0,(ostream *)local_278);
        if ((abStack_258[(long)*(_func_int **)(local_278._0_8_ + -0x18)] & 5) == 0) {
          std::ofstream::close();
        }
        if ((abStack_4a0[*(long *)(local_4c0._0_8_ + -0x18)] & 5) == 0) {
          cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_718,(ostream *)local_4c0,0);
          cmCTest::StartXML((this->super_cmCTestGenericHandler).CTest,(cmXMLWriter *)local_718,
                            (this->super_cmCTestGenericHandler).AppendXML);
          pp_Var2 = (_func_int **)(local_658 + 0x10);
          local_658._0_8_ = pp_Var2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_658,"Configure","");
          cmXMLWriter::StartElement((cmXMLWriter *)local_718,(string *)local_658);
          if ((_func_int **)local_658._0_8_ != pp_Var2) {
            operator_delete((void *)local_658._0_8_,local_648[0]._M_allocated_capacity + 1);
          }
          local_658._0_8_ = pp_Var2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_658,"StartDateTime","");
          cmXMLWriter::StartElement((cmXMLWriter *)local_718,(string *)local_658);
          cmXMLWriter::Content<std::__cxx11::string>((cmXMLWriter *)local_718,&local_4e0);
          cmXMLWriter::EndElement((cmXMLWriter *)local_718);
          if ((_func_int **)local_658._0_8_ != pp_Var2) {
            operator_delete((void *)local_658._0_8_,local_648[0]._M_allocated_capacity + 1);
          }
          local_658._0_8_ = pp_Var2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_658,"StartConfigureTime","");
          cmXMLWriter::Element<unsigned_int>
                    ((cmXMLWriter *)local_718,(string *)local_658,&local_6e4);
          if ((_func_int **)local_658._0_8_ != pp_Var2) {
            operator_delete((void *)local_658._0_8_,local_648[0]._M_allocated_capacity + 1);
          }
          local_658._0_8_ = pp_Var2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_658,"ConfigureCommand","")
          ;
          cmXMLWriter::StartElement((cmXMLWriter *)local_718,(string *)local_658);
          cmXMLWriter::Content<std::__cxx11::string>((cmXMLWriter *)local_718,&local_6c0);
          cmXMLWriter::EndElement((cmXMLWriter *)local_718);
          if ((_func_int **)local_658._0_8_ != pp_Var2) {
            operator_delete((void *)local_658._0_8_,local_648[0]._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_658);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_658,"End",3);
          std::ios::widen((char)(ostream *)local_658 +
                          (char)*(_func_int **)(local_658._0_8_ + -0x18));
          std::ostream::put((char)local_658);
          std::ostream::flush();
          pcVar3 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          local_6e8 = iVar5;
          cmCTest::Log(pcVar3,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                       ,0x62,local_6e0._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
            operator_delete(local_6e0._M_dataplus._M_p,local_6e0.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_658);
          std::ios_base::~ios_base(local_5e8);
          local_658._0_8_ = pp_Var2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_658,"Log","");
          cmXMLWriter::StartElement((cmXMLWriter *)local_718,(string *)local_658);
          cmXMLWriter::Content<std::__cxx11::string>((cmXMLWriter *)local_718,&local_698);
          cmXMLWriter::EndElement((cmXMLWriter *)local_718);
          if ((_func_int **)local_658._0_8_ != pp_Var2) {
            operator_delete((void *)local_658._0_8_,local_648[0]._M_allocated_capacity + 1);
          }
          local_658._0_8_ = pp_Var2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_658,"ConfigureStatus","");
          cmXMLWriter::Element<int>((cmXMLWriter *)local_718,(string *)local_658,&local_71c);
          if ((_func_int **)local_658._0_8_ != pp_Var2) {
            operator_delete((void *)local_658._0_8_,local_648[0]._M_allocated_capacity + 1);
          }
          local_658._0_8_ = pp_Var2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_658,"EndDateTime","");
          cmCTest::CurrentTime_abi_cxx11_(&local_6e0,(this->super_cmCTestGenericHandler).CTest);
          cmXMLWriter::StartElement((cmXMLWriter *)local_718,(string *)local_658);
          cmXMLWriter::Content<std::__cxx11::string>((cmXMLWriter *)local_718,&local_6e0);
          cmXMLWriter::EndElement((cmXMLWriter *)local_718);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
            operator_delete(local_6e0._M_dataplus._M_p,local_6e0.field_2._M_allocated_capacity + 1);
          }
          iVar5 = local_6e8;
          if ((_func_int **)local_658._0_8_ != pp_Var2) {
            operator_delete((void *)local_658._0_8_,local_648[0]._M_allocated_capacity + 1);
          }
          local_658._0_8_ = pp_Var2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_658,"EndConfigureTime","")
          ;
          dVar7 = cmsys::SystemTools::GetTime();
          local_6e0._M_dataplus._M_p._0_4_ = (int)(long)dVar7;
          cmXMLWriter::Element<unsigned_int>
                    ((cmXMLWriter *)local_718,(string *)local_658,(uint *)&local_6e0);
          if ((_func_int **)local_658._0_8_ != pp_Var2) {
            operator_delete((void *)local_658._0_8_,local_648[0]._M_allocated_capacity + 1);
          }
          local_658._0_8_ = pp_Var2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_658,"ElapsedMinutes","");
          dVar7 = cmsys::SystemTools::GetTime();
          local_6e0._M_dataplus._M_p = (pointer)((double)(int)((dVar7 - local_6a0) / 6.0) / 10.0);
          cmXMLWriter::Element<double>
                    ((cmXMLWriter *)local_718,(string *)local_658,(double *)&local_6e0);
          if ((_func_int **)local_658._0_8_ != pp_Var2) {
            operator_delete((void *)local_658._0_8_,local_648[0]._M_allocated_capacity + 1);
          }
          cmXMLWriter::EndElement((cmXMLWriter *)local_718);
          cmCTest::EndXML((this->super_cmCTestGenericHandler).CTest,(cmXMLWriter *)local_718);
          cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_718);
        }
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
          operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
        }
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_4c0);
        if ((iVar5 == 0) || (iVar5 = 0, local_71c != 0)) goto LAB_00276a10;
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_278,"Cannot open configure file",0x1a);
        std::ios::widen((char)(ostream *)local_278 + (char)*(_func_int **)(local_278._0_8_ + -0x18))
        ;
        std::ostream::put((char)local_278);
        std::ostream::flush();
        pcVar3 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar3,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                     ,0x46,(char *)local_658._0_8_,false);
        if ((undefined1 *)local_658._0_8_ != local_658 + 0x10) {
          operator_delete((void *)local_658._0_8_,local_648[0]._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
        std::ios_base::~ios_base(local_208);
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_4c0);
        iVar5 = 1;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_698._M_dataplus._M_p != &local_698.field_2) {
      operator_delete(local_698._M_dataplus._M_p,
                      CONCAT71(local_698.field_2._M_allocated_capacity._1_7_,
                               local_698.field_2._M_local_buf[0]) + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678._M_dataplus._M_p != &local_678.field_2) {
    operator_delete(local_678._M_dataplus._M_p,local_678.field_2._M_allocated_capacity + 1);
  }
LAB_0027749e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c0._M_dataplus._M_p != &local_6c0.field_2) {
    operator_delete(local_6c0._M_dataplus._M_p,local_6c0.field_2._M_allocated_capacity + 1);
  }
  return iVar5;
}

Assistant:

int cmCTestConfigureHandler::ProcessHandler()
{
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
    "Configure project" << std::endl, this->Quiet);
  std::string cCommand
    = this->CTest->GetCTestConfiguration("ConfigureCommand");
  if (cCommand.empty())
    {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
      "Cannot find ConfigureCommand key in the DartConfiguration.tcl"
      << std::endl);
    return -1;
    }

  std::string buildDirectory
    = this->CTest->GetCTestConfiguration("BuildDirectory");
  if (buildDirectory.empty())
    {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
      "Cannot find BuildDirectory  key in the DartConfiguration.tcl"
      << std::endl);
    return -1;
    }

  double elapsed_time_start = cmSystemTools::GetTime();
  std::string output;
  int retVal = 0;
  int res = 0;
  if ( !this->CTest->GetShowOnly() )
    {
    cmGeneratedFileStream os;
    if(!this->StartResultingXML(cmCTest::PartConfigure, "Configure", os))
      {
      cmCTestLog(this->CTest, ERROR_MESSAGE, "Cannot open configure file"
        << std::endl);
      return 1;
      }
    std::string start_time = this->CTest->CurrentTime();
    unsigned int start_time_time = static_cast<unsigned int>(
      cmSystemTools::GetTime());

    cmGeneratedFileStream ofs;
    this->StartLogFile("Configure", ofs);
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
      "Configure with command: " << cCommand << std::endl, this->Quiet);
    res = this->CTest->RunMakeCommand(cCommand.c_str(), output,
      &retVal, buildDirectory.c_str(),
      0, ofs);

    if ( ofs )
      {
      ofs.close();
      }

    if ( os )
      {
      cmXMLWriter xml(os);
      this->CTest->StartXML(xml, this->AppendXML);
      xml.StartElement("Configure");
      xml.Element("StartDateTime", start_time);
      xml.Element("StartConfigureTime", start_time_time);
      xml.Element("ConfigureCommand", cCommand);
      cmCTestOptionalLog(this->CTest, DEBUG, "End" << std::endl, this->Quiet);
      xml.Element("Log", output);
      xml.Element("ConfigureStatus", retVal);
      xml.Element("EndDateTime", this->CTest->CurrentTime());
      xml.Element("EndConfigureTime",
        static_cast<unsigned int>(cmSystemTools::GetTime()));
      xml.Element("ElapsedMinutes", static_cast<int>(
        (cmSystemTools::GetTime() - elapsed_time_start)/6)/10.0);
      xml.EndElement(); // Configure
      this->CTest->EndXML(xml);
      }
    }
  else
    {
    cmCTestOptionalLog(this->CTest, DEBUG,
      "Configure with command: " << cCommand << std::endl, this->Quiet);
    }
  if (! res || retVal )
    {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
      "Error(s) when configuring the project" << std::endl);
    return -1;
    }
  return 0;
}